

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O0

prevector<16U,_unsigned_char,_unsigned_int,_int> * __thiscall
prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
          (prevector<16U,_unsigned_char,_unsigned_int,_int> *this,
          prevector<16U,_unsigned_char,_unsigned_int,_int> *other)

{
  long lVar1;
  undefined4 uVar2;
  size_type sVar3;
  undefined4 uVar4;
  bool bVar5;
  undefined4 *in_RSI;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *in_RDI;
  long in_FS_OFFSET;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = is_direct(in_stack_ffffffffffffffd8);
  if (!bVar5) {
    free((in_RDI->_union).indirect_contents.indirect);
  }
  uVar2 = in_RSI[1];
  sVar3 = in_RSI[2];
  uVar4 = in_RSI[3];
  *(undefined4 *)&in_RDI->_union = *in_RSI;
  *(undefined4 *)((long)&in_RDI->_union + 4) = uVar2;
  (in_RDI->_union).indirect_contents.capacity = sVar3;
  *(undefined4 *)((long)&in_RDI->_union + 0xc) = uVar4;
  in_RDI->_size = in_RSI[4];
  in_RSI[4] = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

prevector& operator=(prevector<N, T, Size, Diff>&& other) noexcept {
        if (!is_direct()) {
            free(_union.indirect_contents.indirect);
        }
        _union = std::move(other._union);
        _size = other._size;
        other._size = 0;
        return *this;
    }